

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc.c
# Opt level: O3

mpc_val_t * mpc_parse_fold(mpc_input_t *i,mpc_fold_t f,int n,mpc_val_t **xs)

{
  mpc_input_t *pmVar1;
  char *pcVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  char *pcVar6;
  char *pcVar7;
  undefined8 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  mpc_input_t *pmVar11;
  mpc_val_t *pmVar12;
  int iVar13;
  ulong uVar14;
  
  if (f == mpcf_null) {
    pmVar12 = (mpc_val_t *)0x0;
  }
  else if (f == mpcf_fst) {
    pmVar12 = *xs;
  }
  else if (f == mpcf_snd) {
    pmVar12 = xs[1];
  }
  else {
    if (f != mpcf_trd) {
      if (f == mpcf_fst_free) {
        iVar13 = 0;
      }
      else if (f == mpcf_snd_free) {
        iVar13 = 1;
      }
      else {
        if (f != mpcf_trd_free) {
          if (f == mpcf_strfold) {
            pmVar12 = mpcf_input_strfold(i,n,xs);
            return pmVar12;
          }
          if (f == mpcf_state_ast) {
            pmVar1 = (mpc_input_t *)*xs;
            pmVar12 = xs[1];
            if (pmVar12 != (mpc_val_t *)0x0) {
              uVar8 = *(undefined8 *)pmVar1;
              pcVar2 = pmVar1->filename;
              lVar3 = (pmVar1->state).row;
              *(long *)((long)pmVar12 + 0x20) = (pmVar1->state).pos;
              *(long *)((long)pmVar12 + 0x28) = lVar3;
              *(undefined8 *)((long)pmVar12 + 0x10) = uVar8;
              *(char **)((long)pmVar12 + 0x18) = pcVar2;
            }
            if (i + 1 <= pmVar1 || pmVar1 < i->mem) {
              free(pmVar1);
              return pmVar12;
            }
            i->mem_full[(ulong)((long)pmVar1 - (long)i->mem) >> 6] = '\0';
            return pmVar12;
          }
          if (n < 1) {
            n = 0;
          }
          else {
            uVar14 = 0;
            do {
              pmVar1 = (mpc_input_t *)xs[uVar14];
              pmVar11 = pmVar1;
              if (pmVar1 < i + 1 && i->mem <= pmVar1) {
                pmVar11 = (mpc_input_t *)malloc(0x40);
                uVar9 = *(undefined4 *)&pmVar1->field_0x4;
                pcVar2 = pmVar1->filename;
                lVar3 = (pmVar1->state).pos;
                lVar4 = (pmVar1->state).row;
                lVar5 = (pmVar1->state).col;
                iVar13 = (pmVar1->state).term;
                uVar10 = *(undefined4 *)&(pmVar1->state).field_0x1c;
                pcVar6 = pmVar1->string;
                pcVar7 = pmVar1->buffer;
                pmVar11->type = pmVar1->type;
                *(undefined4 *)&pmVar11->field_0x4 = uVar9;
                pmVar11->filename = pcVar2;
                (pmVar11->state).pos = lVar3;
                (pmVar11->state).row = lVar4;
                (pmVar11->state).col = lVar5;
                (pmVar11->state).term = iVar13;
                *(undefined4 *)&(pmVar11->state).field_0x1c = uVar10;
                pmVar11->string = pcVar6;
                pmVar11->buffer = pcVar7;
                i->mem_full[(ulong)((long)pmVar1 - (long)i->mem) >> 6] = '\0';
              }
              xs[uVar14] = pmVar11;
              uVar14 = uVar14 + 1;
            } while ((uint)n != uVar14);
          }
          pmVar12 = (*f)(n,xs);
          return pmVar12;
        }
        iVar13 = 2;
      }
      pmVar12 = mpcf_input_nth_free(i,n,xs,iVar13);
      return pmVar12;
    }
    pmVar12 = xs[2];
  }
  return pmVar12;
}

Assistant:

static mpc_val_t *mpc_parse_fold(mpc_input_t *i, mpc_fold_t f, int n, mpc_val_t **xs) {
  int j;
  if (f == mpcf_null)      { return mpcf_null(n, xs); }
  if (f == mpcf_fst)       { return mpcf_fst(n, xs); }
  if (f == mpcf_snd)       { return mpcf_snd(n, xs); }
  if (f == mpcf_trd)       { return mpcf_trd(n, xs); }
  if (f == mpcf_fst_free)  { return mpcf_input_fst_free(i, n, xs); }
  if (f == mpcf_snd_free)  { return mpcf_input_snd_free(i, n, xs); }
  if (f == mpcf_trd_free)  { return mpcf_input_trd_free(i, n, xs); }
  if (f == mpcf_strfold)   { return mpcf_input_strfold(i, n, xs); }
  if (f == mpcf_state_ast) { return mpcf_input_state_ast(i, n, xs); }
  for (j = 0; j < n; j++) { xs[j] = mpc_export(i, xs[j]); }
  return f(j, xs);
}